

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::MatchTrimEnds(ON_Brep *this)

{
  bool bVar1;
  int iVar2;
  ON_BrepLoop *Loop;
  int local_18;
  bool local_11;
  int i;
  bool rc;
  ON_Brep *this_local;
  
  local_11 = true;
  local_18 = 0;
  while( true ) {
    iVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
    if (iVar2 <= local_18) break;
    Loop = ON_ClassArray<ON_BrepLoop>::operator[]((ON_ClassArray<ON_BrepLoop> *)&this->m_L,local_18)
    ;
    bVar1 = MatchTrimEnds(this,Loop);
    if (!bVar1) {
      local_11 = false;
    }
    local_18 = local_18 + 1;
  }
  return local_11;
}

Assistant:

bool ON_Brep::MatchTrimEnds()

{
  bool rc = true;
  for (int i=0; i<m_L.Count(); i++){
    if (!MatchTrimEnds(m_L[i])) rc = false;
  }
  return rc;
}